

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void substrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mem *pMem;
  sqlite3_value *psVar4;
  int iVar5;
  i64 iVar6;
  char *z;
  char *pcVar7;
  sqlite3_uint64 sVar8;
  sqlite3_uint64 sVar9;
  sqlite3_uint64 sVar10;
  sqlite3_uint64 sVar11;
  int iVar12;
  sqlite3_uint64 sVar13;
  int iVar14;
  bool bVar15;
  
  pMem = argv[1];
  uVar1._0_2_ = pMem->flags;
  uVar1._2_1_ = pMem->enc;
  uVar1._3_1_ = pMem->eSubtype;
  if (((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) == 0) &&
     ((argc != 3 ||
      (psVar4 = argv[2], uVar2._0_2_ = psVar4->flags, uVar2._2_1_ = psVar4->enc,
      uVar2._3_1_ = psVar4->eSubtype, (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))) {
    psVar4 = *argv;
    uVar3._0_2_ = psVar4->flags;
    uVar3._2_1_ = psVar4->enc;
    uVar3._3_1_ = psVar4->eSubtype;
    iVar6 = sqlite3VdbeIntValue(pMem);
    iVar14 = (int)iVar6;
    if ((0x1000000010001U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      z = (char *)sqlite3ValueText(*argv,'\x01');
      if (z != (char *)0x0) {
        iVar12 = 0;
        if ((iVar14 < 0) && (iVar12 = 0, *z != '\0')) {
          iVar12 = 0;
          pcVar7 = z;
          do {
            pcVar7 = pcVar7 + 1;
            iVar12 = iVar12 + 1;
          } while (*pcVar7 != '\0');
        }
LAB_001b7b92:
        if (argc == 3) {
          iVar6 = sqlite3VdbeIntValue(argv[2]);
          iVar5 = (int)iVar6;
          bVar15 = -1 < iVar5;
          sVar11 = -(long)iVar5;
          if (bVar15) {
            sVar11 = (long)iVar5;
          }
        }
        else {
          bVar15 = true;
          sVar11 = (long)context->pOut->db->aLimit[0];
        }
        if (iVar14 < 0) {
          sVar13 = (long)iVar14 + (long)iVar12;
          if ((long)sVar13 < 0) {
            sVar11 = sVar11 + sVar13;
            sVar13 = 0;
            if ((long)sVar11 < 1) {
              sVar11 = sVar13;
            }
          }
        }
        else if (iVar14 == 0) {
          sVar13 = 0;
          sVar11 = sVar11 - (0 < (long)sVar11);
        }
        else {
          sVar13 = (long)iVar14 - 1;
        }
        sVar8 = sVar13 - sVar11;
        sVar10 = 0;
        if (0 < (long)sVar8) {
          sVar10 = sVar8;
        }
        sVar9 = sVar11;
        if ((long)sVar8 < 0) {
          sVar9 = sVar13;
        }
        if (bVar15) {
          sVar9 = sVar11;
          sVar10 = sVar13;
        }
        if ((0x1000000010001U >> ((byte)(undefined2)uVar3 & 0x3f) & 1) != 0) {
          sVar13 = (long)iVar12 - sVar10;
          sVar11 = 0;
          if (0 < (long)sVar13) {
            sVar11 = sVar13;
          }
          if ((long)(sVar9 + sVar10) <= (long)iVar12) {
            sVar11 = sVar9;
          }
          sqlite3_result_blob64(context,z + sVar10,sVar11,(_func_void_void_ptr *)0xffffffffffffffff)
          ;
          return;
        }
        if (*z != '\0') {
          while ((sVar10 != 0 && (z = z + 1, *z != '\0'))) {
            sVar10 = sVar10 - 1;
          }
        }
        pcVar7 = z;
        if (*z != '\0') {
          while ((sVar9 != 0 && (pcVar7 = pcVar7 + 1, *pcVar7 != '\0'))) {
            sVar9 = sVar9 - 1;
          }
        }
        sqlite3_result_text64
                  (context,z,(long)pcVar7 - (long)z,(_func_void_void_ptr *)0xffffffffffffffff,'\x01'
                  );
        return;
      }
    }
    else {
      iVar12 = sqlite3ValueBytes(*argv,'\x01');
      z = (char *)sqlite3_value_blob(*argv);
      if (z != (char *)0x0) goto LAB_001b7b92;
    }
  }
  return;
}

Assistant:

static void substrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z;
  const unsigned char *z2;
  int len;
  int p0type;
  i64 p1, p2;
  int negP2 = 0;

  assert( argc==3 || argc==2 );
  if( sqlite3_value_type(argv[1])==SQLITE_NULL
   || (argc==3 && sqlite3_value_type(argv[2])==SQLITE_NULL)
  ){
    return;
  }
  p0type = sqlite3_value_type(argv[0]);
  p1 = sqlite3_value_int(argv[1]);
  if( p0type==SQLITE_BLOB ){
    len = sqlite3_value_bytes(argv[0]);
    z = sqlite3_value_blob(argv[0]);
    if( z==0 ) return;
    assert( len==sqlite3_value_bytes(argv[0]) );
  }else{
    z = sqlite3_value_text(argv[0]);
    if( z==0 ) return;
    len = 0;
    if( p1<0 ){
      for(z2=z; *z2; len++){
        SQLITE_SKIP_UTF8(z2);
      }
    }
  }
#ifdef SQLITE_SUBSTR_COMPATIBILITY
  /* If SUBSTR_COMPATIBILITY is defined then substr(X,0,N) work the same as
  ** as substr(X,1,N) - it returns the first N characters of X.  This
  ** is essentially a back-out of the bug-fix in check-in [5fc125d362df4b8]
  ** from 2009-02-02 for compatibility of applications that exploited the
  ** old buggy behavior. */
  if( p1==0 ) p1 = 1; /* <rdar://problem/6778339> */
#endif
  if( argc==3 ){
    p2 = sqlite3_value_int(argv[2]);
    if( p2<0 ){
      p2 = -p2;
      negP2 = 1;
    }
  }else{
    p2 = sqlite3_context_db_handle(context)->aLimit[SQLITE_LIMIT_LENGTH];
  }
  if( p1<0 ){
    p1 += len;
    if( p1<0 ){
      p2 += p1;
      if( p2<0 ) p2 = 0;
      p1 = 0;
    }
  }else if( p1>0 ){
    p1--;
  }else if( p2>0 ){
    p2--;
  }
  if( negP2 ){
    p1 -= p2;
    if( p1<0 ){
      p2 += p1;
      p1 = 0;
    }
  }
  assert( p1>=0 && p2>=0 );
  if( p0type!=SQLITE_BLOB ){
    while( *z && p1 ){
      SQLITE_SKIP_UTF8(z);
      p1--;
    }
    for(z2=z; *z2 && p2; p2--){
      SQLITE_SKIP_UTF8(z2);
    }
    sqlite3_result_text64(context, (char*)z, z2-z, SQLITE_TRANSIENT,
                          SQLITE_UTF8);
  }else{
    if( p1+p2>len ){
      p2 = len-p1;
      if( p2<0 ) p2 = 0;
    }
    sqlite3_result_blob64(context, (char*)&z[p1], (u64)p2, SQLITE_TRANSIENT);
  }
}